

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slimc.c
# Opt level: O2

object * newAnonymousObj(int cl)

{
  object *poVar1;
  object *poVar2;
  object *poVar3;
  
  poVar1 = guard;
  poVar3 = topScope;
  do {
    poVar2 = poVar3;
    poVar3 = poVar2->next;
  } while (poVar3 != guard);
  poVar3 = (object *)calloc(1,0x90);
  poVar3->cl = cl;
  poVar3->next = poVar1;
  poVar2->next = poVar3;
  return poVar3;
}

Assistant:

object * newAnonymousObj(int cl) {
	variable struct object *newObj; variable struct object *x;
	newObj=NULL; x=topScope;
	while (x->next != guard) { 
		x = x->next; 
	}
	allocMem(newObj);
	newObj->cl = cl; newObj->next = guard; x->next = newObj;
	return newObj;
}